

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels_resize
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                int target_width,int target_height,Allocator *allocator)

{
  int *piVar1;
  Mat local_88;
  Mat *local_38;
  
  if (h == target_height && w == target_width) {
    from_pixels(__return_storage_ptr__,pixels,type,w,h,stride,allocator);
    return __return_storage_ptr__;
  }
  if ((type & 0xffffU) - 1 < 2) {
    local_38 = (Mat *)CONCAT44(local_38._4_4_,type);
    local_88.cstep = 0;
    local_88.data = (uchar *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88._20_8_ = 0;
    local_88.allocator = (Allocator *)0x0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
    create(&local_88,target_width,target_height,3,3,(Allocator *)0x0);
    resize_bilinear_c3(pixels,w,h,stride,(uchar *)local_88.data,target_width,target_height,
                       target_width * 3);
    from_pixels(__return_storage_ptr__,(uchar *)local_88.data,(int)local_38,target_width,
                target_height,allocator);
    piVar1 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return __return_storage_ptr__;
    }
    if (local_88.allocator != (Allocator *)0x0) {
      (*(local_88.allocator)->_vptr_Allocator[3])();
      return __return_storage_ptr__;
    }
  }
  else {
    local_38 = __return_storage_ptr__;
    if ((type & 0xffffU) == 3) {
      local_88.cstep = 0;
      local_88.data = (uchar *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      create(&local_88,target_width,target_height,1,1,(Allocator *)0x0);
      resize_bilinear_c1(pixels,w,h,stride,(uchar *)local_88.data,target_width,target_height,
                         target_width);
      __return_storage_ptr__ = local_38;
      from_pixels(local_38,(uchar *)local_88.data,type,target_width,target_height,allocator);
      piVar1 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar1 == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return __return_storage_ptr__;
      }
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        return __return_storage_ptr__;
      }
    }
    else {
      if ((type & 0xfffeU) != 4) {
        from_pixels_resize();
        return __return_storage_ptr__;
      }
      local_88.cstep = 0;
      local_88.data = (uchar *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      create(&local_88,target_width,target_height,4,4,(Allocator *)0x0);
      resize_bilinear_c4(pixels,w,h,stride,(uchar *)local_88.data,target_width,target_height,
                         target_width * 4);
      __return_storage_ptr__ = local_38;
      from_pixels(local_38,(uchar *)local_88.data,type,target_width,target_height,allocator);
      piVar1 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar1 == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return __return_storage_ptr__;
      }
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        return __return_storage_ptr__;
      }
    }
  }
  if ((uchar *)local_88.data != (uchar *)0x0) {
    local_88.allocator = (Allocator *)0x0;
    free(local_88.data);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}